

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# satInter.c
# Opt level: O2

int Int_ManProofRecordOne(Int_Man_t *p,Sto_Cls_t *pClause)

{
  int iVar1;
  Sto_Cls_t *pSVar2;
  uint uVar3;
  ulong uVar4;
  uint uVar5;
  int iVar6;
  ulong uVar7;
  
  uVar3 = *(uint *)&pClause->field_0x1c;
  if ((uVar3 & 0x7fffff8) == 0) {
    __assert_fail("pClause->nLits > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bsat/satInter.c"
                  ,0x308,"int Int_ManProofRecordOne(Int_Man_t *, Sto_Cls_t *)");
  }
  if ((uVar3 & 2) != 0) {
    __assert_fail("!pClause->fRoot",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bsat/satInter.c"
                  ,0x30d,"int Int_ManProofRecordOne(Int_Man_t *, Sto_Cls_t *)");
  }
  if (p->nTrailSize != p->nRootSize) {
    __assert_fail("p->nTrailSize == p->nRootSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bsat/satInter.c"
                  ,0x30e,"int Int_ManProofRecordOne(Int_Man_t *, Sto_Cls_t *)");
  }
  uVar4 = 0;
  iVar6 = 1;
  while ((uVar3 >> 3 & 0xffffff) != uVar4) {
    iVar1 = *(int *)((long)&pClause[1].pNext + uVar4 * 4);
    uVar4 = uVar4 + 1;
    if (p->pAssigns[iVar1 >> 1] == iVar1) {
      return 1;
    }
  }
  uVar4 = 0;
  while (uVar4 < (*(uint *)&pClause->field_0x1c >> 3 & 0xffffff)) {
    iVar1 = Int_ManEnqueue(p,*(uint *)((long)&pClause[1].pNext + uVar4 * 4) ^ 1,(Sto_Cls_t *)0x0);
    uVar4 = uVar4 + 1;
    if (iVar1 == 0) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bsat/satInter.c"
                    ,0x319,"int Int_ManProofRecordOne(Int_Man_t *, Sto_Cls_t *)");
    }
  }
  pSVar2 = Int_ManPropagate(p,p->nRootSize);
  if (pSVar2 == (Sto_Cls_t *)0x0) {
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bsat/satInter.c"
                  ,0x321,"int Int_ManProofRecordOne(Int_Man_t *, Sto_Cls_t *)");
  }
  uVar3 = *(uint *)&pClause->field_0x1c >> 3 & 0xffffff;
  uVar5 = *(uint *)&pSVar2->field_0x1c >> 3 & 0xffffff;
  if (uVar3 < uVar5) {
LAB_0046032f:
    Int_ManProofTraceOne(p,pSVar2,pClause);
    Int_ManCancelUntil(p,p->nRootSize);
    uVar3 = *(uint *)&pClause->field_0x1c >> 3 & 0xffffff;
    if (uVar3 < 2) {
      if (uVar3 != 1) {
        __assert_fail("pClause->nLits == 1",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bsat/satInter.c"
                      ,0x347,"int Int_ManProofRecordOne(Int_Man_t *, Sto_Cls_t *)");
      }
      iVar1 = Int_ManEnqueue(p,*(lit *)&pClause[1].pNext,pClause);
      if (iVar1 == 0) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bsat/satInter.c"
                      ,0x34c,"int Int_ManProofRecordOne(Int_Man_t *, Sto_Cls_t *)");
      }
      pSVar2 = Int_ManPropagate(p,p->nRootSize);
      if (pSVar2 == (Sto_Cls_t *)0x0) {
        p->nRootSize = p->nTrailSize;
      }
      else {
        Int_ManProofTraceOne(p,pSVar2,p->pCnf->pEmpty);
        if (p->fVerbose == 0) {
          iVar6 = 0;
        }
        else {
          iVar6 = 0;
          printf("Found last conflict after adding unit clause number %d!\n",
                 (ulong)(uint)pClause->Id);
        }
      }
    }
    else {
      Int_ManWatchClause(p,pClause,*(lit *)&pClause[1].pNext);
      Int_ManWatchClause(p,pClause,*(lit *)((long)&pClause[1].pNext + 4));
    }
  }
  else {
    for (uVar4 = 0; uVar4 != uVar5; uVar4 = uVar4 + 1) {
      uVar7 = 0;
      while( true ) {
        if (uVar3 == uVar7) goto LAB_0046031b;
        if (*(int *)((long)&pSVar2[1].pNext + uVar4 * 4) ==
            *(int *)((long)&pClause[1].pNext + uVar7 * 4)) break;
        uVar7 = uVar7 + 1;
      }
      if (uVar3 == (uint)uVar7) {
LAB_0046031b:
        if (uVar5 != (uint)uVar4) goto LAB_0046032f;
        break;
      }
    }
    Int_ManCancelUntil(p,p->nRootSize);
  }
  return iVar6;
}

Assistant:

int Int_ManProofRecordOne( Int_Man_t * p, Sto_Cls_t * pClause )
{
    Sto_Cls_t * pConflict;
    int i;

    // empty clause never ends up there
    assert( pClause->nLits > 0 );
    if ( pClause->nLits == 0 )
        printf( "Error: Empty clause is attempted.\n" );

    // add assumptions to the trail
    assert( !pClause->fRoot );
    assert( p->nTrailSize == p->nRootSize );

    // if any of the clause literals are already assumed
    // it means that the clause is redundant and can be skipped
    for ( i = 0; i < (int)pClause->nLits; i++ )
        if ( p->pAssigns[lit_var(pClause->pLits[i])] == pClause->pLits[i] )
            return 1;

    for ( i = 0; i < (int)pClause->nLits; i++ )
        if ( !Int_ManEnqueue( p, lit_neg(pClause->pLits[i]), NULL ) )
        {
            assert( 0 ); // impossible
            return 0;
        }

    // propagate the assumptions
    pConflict = Int_ManPropagate( p, p->nRootSize );
    if ( pConflict == NULL )
    {
        assert( 0 ); // cannot prove
        return 0;
    }

    // skip the clause if it is weaker or the same as the conflict clause
    if ( pClause->nLits >= pConflict->nLits )
    {
        // check if every literal of conflict clause can be found in the given clause
        int j;
        for ( i = 0; i < (int)pConflict->nLits; i++ )
        {
            for ( j = 0; j < (int)pClause->nLits; j++ )
                if ( pConflict->pLits[i] == pClause->pLits[j] )
                    break;
            if ( j == (int)pClause->nLits ) // literal pConflict->pLits[i] is not found
                break;
        }
        if ( i == (int)pConflict->nLits ) // all lits are found
        {
            // undo to the root level
            Int_ManCancelUntil( p, p->nRootSize );
            return 1;
        }
    }

    // construct the proof
    Int_ManProofTraceOne( p, pConflict, pClause );

    // undo to the root level
    Int_ManCancelUntil( p, p->nRootSize );

    // add large clauses to the watched lists
    if ( pClause->nLits > 1 )
    {
        Int_ManWatchClause( p, pClause, pClause->pLits[0] );
        Int_ManWatchClause( p, pClause, pClause->pLits[1] );
        return 1;
    }
    assert( pClause->nLits == 1 );

    // if the clause proved is unit, add it and propagate
    if ( !Int_ManEnqueue( p, pClause->pLits[0], pClause ) )
    {
        assert( 0 ); // impossible
        return 0;
    }

    // propagate the assumption
    pConflict = Int_ManPropagate( p, p->nRootSize );
    if ( pConflict )
    {
        // construct the proof
        Int_ManProofTraceOne( p, pConflict, p->pCnf->pEmpty );
        if ( p->fVerbose )
            printf( "Found last conflict after adding unit clause number %d!\n", pClause->Id );
        return 0;
    }

    // update the root level
    p->nRootSize = p->nTrailSize;
    return 1;
}